

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ActiveAtomicCounterBuffersCase::iterate
          (ActiveAtomicCounterBuffersCase *this)

{
  TestLog *pTVar1;
  Context *pCVar2;
  RenderContext *pRVar3;
  int iVar4;
  undefined4 extraout_var;
  ProgramSources *pPVar5;
  TestError *pTVar6;
  ScopedLogSection section_1;
  string local_270;
  ScopedLogSection section;
  string local_248 [32];
  CallLogWrapper gl;
  Program program;
  GLuint local_178;
  bool local_150;
  ProgramSources local_140;
  ResultCollector result;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program," // ERROR: ",(allocator<char> *)&local_140);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,(string *)&program);
  std::__cxx11::string::~string((string *)&program);
  gl.m_enableLog = true;
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,"Initial",(allocator<char> *)&local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"Initial",(allocator<char> *)&section_1);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&program,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&program);
  glu::Program::Program(&program,((this->super_TestCase).m_context)->m_renderCtx);
  deqp::gls::StateQueryUtil::verifyStateProgramInteger
            (&result,&gl,program.m_program,0x92d9,0,this->m_verifier);
  glu::Program::~Program(&program);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,"NoBuffers",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"No buffers",(allocator<char> *)&local_270);
  pPVar5 = &local_140;
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,(string *)&program,(string *)pPVar5);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&program);
  pCVar2 = (this->super_TestCase).m_context;
  pRVar3 = pCVar2->m_renderCtx;
  memset(&local_140,0,0xac);
  local_140.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_140.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_140.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_140._193_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_270,(_anonymous_namespace_ *)pCVar2,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout (local_size_x = 3) in;\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = 1.0;\n}\n"
             ,(char *)pPVar5);
  glu::ComputeSource::ComputeSource((ComputeSource *)&section,&local_270);
  pPVar5 = glu::ProgramSources::operator<<(&local_140,(ShaderSource *)&section);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)&program,pRVar3,pPVar5);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string((string *)&local_270);
  glu::ProgramSources::~ProgramSources(&local_140);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (ShaderProgram *)&program);
  if (local_150 == false) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"failed to build program","program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
               ,0x255);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  deqp::gls::StateQueryUtil::verifyStateProgramInteger
            (&result,&gl,local_178,0x92d9,0,this->m_verifier);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&program);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,"OneBuffer",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"One buffer",(allocator<char> *)&local_270);
  pPVar5 = &local_140;
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,(string *)&program,(string *)pPVar5);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&program);
  pCVar2 = (this->super_TestCase).m_context;
  pRVar3 = pCVar2->m_renderCtx;
  memset(&local_140,0,0xac);
  local_140.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_140.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_140.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_140._193_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_270,(_anonymous_namespace_ *)pCVar2,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout (local_size_x = 3) in;\nlayout(binding = 0) uniform highp atomic_uint u_counters[2];\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = float(atomicCounterIncrement(u_counters[0])) + float(atomicCounterIncrement(u_counters[1]));\n}\n"
             ,(char *)pPVar5);
  glu::ComputeSource::ComputeSource((ComputeSource *)&section,&local_270);
  pPVar5 = glu::ProgramSources::operator<<(&local_140,(ShaderSource *)&section);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)&program,pRVar3,pPVar5);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string((string *)&local_270);
  glu::ProgramSources::~ProgramSources(&local_140);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (ShaderProgram *)&program);
  if (local_150 != false) {
    deqp::gls::StateQueryUtil::verifyStateProgramInteger
              (&result,&gl,local_178,0x92d9,1,this->m_verifier);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&program);
    tcu::ScopedLogSection::~ScopedLogSection(&section_1);
    tcu::ResultCollector::setTestContextResult
              (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::ResultCollector::~ResultCollector(&result);
    glu::CallLogWrapper::~CallLogWrapper(&gl);
    return STOP;
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"failed to build program","program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
             ,0x260);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ActiveAtomicCounterBuffersCase::IterateResult ActiveAtomicCounterBuffersCase::iterate (void)
{
	static const char* const	s_computeTemplate0	=	"${GLSL_VERSION_DECL}\n"
														"layout (local_size_x = 3) in;\n"
														"layout(binding = 0) buffer Output\n"
														"{\n"
														"	highp float val;\n"
														"} sb_out;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														"	sb_out.val = 1.0;\n"
														"}\n";
	static const char* const	s_computeTemplate1	=	"${GLSL_VERSION_DECL}\n"
														"layout (local_size_x = 3) in;\n"
														"layout(binding = 0) uniform highp atomic_uint u_counters[2];\n"
														"layout(binding = 0) buffer Output\n"
														"{\n"
														"	highp float val;\n"
														"} sb_out;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														"	sb_out.val = float(atomicCounterIncrement(u_counters[0])) + float(atomicCounterIncrement(u_counters[1]));\n"
														"}\n";

	glu::CallLogWrapper			gl						(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector		result					(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Initial", "Initial");
		glu::Program				program		(m_context.getRenderContext());

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_ACTIVE_ATOMIC_COUNTER_BUFFERS, 0, m_verifier);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "NoBuffers", "No buffers");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, s_computeTemplate0)));

		m_testCtx.getLog() << program;

		TCU_CHECK_MSG(program.isOk(), "failed to build program");

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_ACTIVE_ATOMIC_COUNTER_BUFFERS, 0, m_verifier);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "OneBuffer", "One buffer");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, s_computeTemplate1)));

		m_testCtx.getLog() << program;

		TCU_CHECK_MSG(program.isOk(), "failed to build program");

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_ACTIVE_ATOMIC_COUNTER_BUFFERS, 1, m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}